

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyline.h
# Opt level: O2

void anurbs::Polyline<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *pcVar1;
  string name;
  class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_> local_c0;
  char *local_b8 [4];
  arg local_98;
  arg local_88;
  code *local_78;
  undefined8 local_70;
  arg local_68;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_>::class_<>
            (&local_c0,(m->super_object).super_handle.m_ptr,local_b8[0]);
  local_28.name = "nb_points";
  local_28._8_1_ = 2;
  pybind11::detail::initimpl::constructor<long>::
  execute<pybind11::class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_>,_pybind11::arg,_0>
            (&local_c0,&local_28);
  local_38.name = "points";
  local_38._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  ::
  execute<pybind11::class_<anurbs::Polyline<2L>,_std::shared_ptr<anurbs::Polyline<2L>_>_>,_pybind11::arg,_0>
            (&local_c0,&local_38);
  local_48 = Polyline<2L>::nb_points;
  local_40 = 0;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<long(anurbs::Polyline<2l>::*)()const>
                     ((class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
                      &local_c0,"nb_points",(offset_in_Model_to_subr *)&local_48);
  local_58 = Polyline<2L>::point;
  local_50 = 0;
  local_68.name = "index";
  local_68._8_1_ = 2;
  pcVar1 = (class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>> *)
           pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::Polyline<2l>::*)(unsigned_long)const,pybind11::arg>
                     (pcVar1,"point",(offset_in_Model_to_subr *)&local_58,&local_68);
  local_78 = Polyline<2L>::set_point;
  local_70 = 0;
  local_88.name = "index";
  local_88._8_1_ = 2;
  local_98.name = "value";
  local_98._8_1_ = 2;
  pybind11::class_<anurbs::Polyline<2l>,std::shared_ptr<anurbs::Polyline<2l>>>::
  def<void(anurbs::Polyline<2l>::*)(unsigned_long,Eigen::Matrix<double,1,2,1,1,2>const&),pybind11::arg,pybind11::arg>
            (pcVar1,"set_point",(offset_in_Model_to_subr *)&local_78,&local_88,&local_98);
  pybind11::object::~object((object *)&local_c0);
  Model::register_python_data_type<anurbs::Polyline<2l>>(m,model);
  std::__cxx11::string::~string((string *)local_b8);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            .def(py::init<Index>(), "nb_points"_a)
            .def(py::init<std::vector<Vector>>(), "points"_a)
            .def("nb_points", &Type::nb_points)
            .def("point", &Type::point, "index"_a)
            .def("set_point", &Type::set_point, "index"_a, "value"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }